

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Dist_graph_neighbors
              (MPIABI_Comm comm,int maxindeegree,int *sources,int *wourceweights,int maxoutdegree,
              int *destinations,int *destweights)

{
  int iVar1;
  ompi_communicator_t *poVar2;
  WPI_Handle<ompi_communicator_t_*> local_40;
  int *local_38;
  int *destinations_local;
  int *piStack_28;
  int maxoutdegree_local;
  int *wourceweights_local;
  int *sources_local;
  MPIABI_Comm MStack_10;
  int maxindeegree_local;
  MPIABI_Comm comm_local;
  
  local_38 = destinations;
  destinations_local._4_4_ = maxoutdegree;
  piStack_28 = wourceweights;
  wourceweights_local = sources;
  sources_local._4_4_ = maxindeegree;
  MStack_10 = comm;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_40,comm);
  poVar2 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_40);
  iVar1 = MPI_Dist_graph_neighbors
                    (poVar2,sources_local._4_4_,wourceweights_local,piStack_28,
                     destinations_local._4_4_,local_38,destweights);
  return iVar1;
}

Assistant:

int MPIABI_Dist_graph_neighbors(
  MPIABI_Comm comm,
  int maxindeegree,
  int * sources,
  int * wourceweights,
  int maxoutdegree,
  int * destinations,
  int * destweights
) {
  return MPI_Dist_graph_neighbors(
    (MPI_Comm)(WPI_Comm)comm,
    maxindeegree,
    sources,
    wourceweights,
    maxoutdegree,
    destinations,
    destweights
  );
}